

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateEncoderUnionBody(SwiftGenerator *this,FieldDef *field)

{
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar1;
  reference ppEVar2;
  bool bVar3;
  bool local_472;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined1 local_340 [8];
  string type_1;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_310;
  const_iterator it_1;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  undefined4 local_1f0;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string type;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_150;
  const_iterator it;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  Type local_48;
  bool local_21;
  EnumDef *pEStack_20;
  bool is_vector;
  EnumDef *union_def;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  pEStack_20 = (field->value).type.enum_def;
  local_472 = true;
  if ((field->value).type.base_type != BASE_TYPE_VECTOR) {
    local_472 = (field->value).type.base_type == BASE_TYPE_ARRAY;
  }
  local_21 = local_472;
  bVar3 = true;
  union_def = (EnumDef *)field;
  field_local = (FieldDef *)this;
  if (((field->value).type.base_type != BASE_TYPE_UTYPE) && (bVar3 = false, local_472 != false)) {
    Type::VectorType(&local_48,&(field->value).type);
    bVar3 = local_48.base_type == BASE_TYPE_UTYPE;
  }
  if (!bVar3) {
    if ((local_21 & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"switch {{FIELDVAR}}Type {",
                 (allocator<char> *)((long)&it_1._M_current + 7));
      CodeWriter::operator+=(&this->code_,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
      pvVar1 = EnumDef::Vals(pEStack_20);
      local_310._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar1);
      while( true ) {
        pvVar1 = EnumDef::Vals(pEStack_20);
        ev_1 = (EnumVal *)
               std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                         (pvVar1);
        bVar3 = __gnu_cxx::operator!=
                          (&local_310,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev_1);
        if (!bVar3) break;
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_310);
        type_1.field_2._8_8_ = *ppEVar2;
        GenType_abi_cxx11_((string *)local_340,this,&((EnumVal *)type_1.field_2._8_8_)->union_type,
                           false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"KEY",&local_361);
        IdlNamer::LegacySwiftVariant_abi_cxx11_
                  (&local_388,&this->namer_,(EnumVal *)type_1.field_2._8_8_);
        CodeWriter::SetValue(&this->code_,&local_360,&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"VALUETYPE",&local_3a9);
        CodeWriter::SetValue(&this->code_,&local_3a8,(string *)local_340);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
        if (*(int *)(type_1.field_2._8_8_ + 0x38) == 0) {
          local_1f0 = 7;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"case .{{KEY}}:",&local_3d1);
          CodeWriter::operator+=(&this->code_,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          Indent(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,"let _v = {{FIELDVAR}}(type: {{VALUETYPE}}.self)",
                     &local_3f9);
          CodeWriter::operator+=(&this->code_,&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::allocator<char>::~allocator(&local_3f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_420,"try container.encodeIfPresent(_v, forKey: .{{FIELDVAR}})"
                     ,&local_421);
          CodeWriter::operator+=(&this->code_,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::allocator<char>::~allocator(&local_421);
          Outdent(this);
          local_1f0 = 0;
        }
        std::__cxx11::string::~string((string *)local_340);
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_310);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"default: break;",&local_449);
      CodeWriter::operator+=(&this->code_,&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator(&local_449);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"}",&local_471);
      CodeWriter::operator+=(&this->code_,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,
                 "var enumsEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}}Type)",
                 &local_69);
      CodeWriter::operator+=(&this->code_,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 "var contentEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}})",
                 &local_a1);
      CodeWriter::operator+=(&this->code_,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"for index in 0..<{{FIELDVAR}}Count {",&local_c9);
      CodeWriter::operator+=(&this->code_,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      Indent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "guard let type = {{FIELDVAR}}Type(at: index) else { continue }",&local_f1);
      CodeWriter::operator+=(&this->code_,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"try enumsEncoder.encode(type)",&local_119);
      CodeWriter::operator+=(&this->code_,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"switch type {",(allocator<char> *)((long)&it._M_current + 7))
      ;
      CodeWriter::operator+=(&this->code_,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      pvVar1 = EnumDef::Vals(pEStack_20);
      local_150._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar1);
      while( true ) {
        pvVar1 = EnumDef::Vals(pEStack_20);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar1);
        bVar3 = __gnu_cxx::operator!=
                          (&local_150,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar3) break;
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_150);
        type.field_2._8_8_ = *ppEVar2;
        GenType_abi_cxx11_((string *)local_180,this,&((EnumVal *)type.field_2._8_8_)->union_type,
                           false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"KEY",&local_1a1);
        IdlNamer::LegacySwiftVariant_abi_cxx11_
                  (&local_1c8,&this->namer_,(EnumVal *)type.field_2._8_8_);
        CodeWriter::SetValue(&this->code_,&local_1a0,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"VALUETYPE",&local_1e9);
        CodeWriter::SetValue(&this->code_,&local_1e8,(string *)local_180);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        if (*(int *)(type.field_2._8_8_ + 0x38) == 0) {
          local_1f0 = 4;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"case .{{KEY}}:",&local_211);
          CodeWriter::operator+=(&this->code_,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator(&local_211);
          Indent(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "let _v = {{FIELDVAR}}(at: index, type: {{VALUETYPE}}.self)",&local_239);
          CodeWriter::operator+=(&this->code_,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator(&local_239);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,"try contentEncoder.encode(_v)",&local_261);
          CodeWriter::operator+=(&this->code_,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
          Outdent(this);
          local_1f0 = 0;
        }
        std::__cxx11::string::~string((string *)local_180);
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_150);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"default: break;",&local_289);
      CodeWriter::operator+=(&this->code_,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"}",&local_2b1);
      CodeWriter::operator+=(&this->code_,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"}",&local_2d9);
      CodeWriter::operator+=(&this->code_,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
  }
  return;
}

Assistant:

void GenerateEncoderUnionBody(const FieldDef &field) {
    EnumDef &union_def = *field.value.type.enum_def;
    const auto is_vector = field.value.type.base_type == BASE_TYPE_VECTOR ||
                           field.value.type.base_type == BASE_TYPE_ARRAY;
    if (field.value.type.base_type == BASE_TYPE_UTYPE ||
        (is_vector &&
         field.value.type.VectorType().base_type == BASE_TYPE_UTYPE))
      return;
    if (is_vector) {
      code_ +=
          "var enumsEncoder = container.nestedUnkeyedContainer(forKey: "
          ".{{FIELDVAR}}Type)";
      code_ +=
          "var contentEncoder = container.nestedUnkeyedContainer(forKey: "
          ".{{FIELDVAR}})";
      code_ += "for index in 0..<{{FIELDVAR}}Count {";
      Indent();
      code_ += "guard let type = {{FIELDVAR}}Type(at: index) else { continue }";
      code_ += "try enumsEncoder.encode(type)";
      code_ += "switch type {";
      for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        const auto type = GenType(ev.union_type);
        code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
        code_.SetValue("VALUETYPE", type);
        if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
        code_ += "case .{{KEY}}:";
        Indent();
        code_ += "let _v = {{FIELDVAR}}(at: index, type: {{VALUETYPE}}.self)";
        code_ += "try contentEncoder.encode(_v)";
        Outdent();
      }
      code_ += "default: break;";
      code_ += "}";
      Outdent();
      code_ += "}";
      return;
    }

    code_ += "switch {{FIELDVAR}}Type {";
    for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
         ++it) {
      const auto &ev = **it;
      const auto type = GenType(ev.union_type);
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUETYPE", type);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_ += "case .{{KEY}}:";
      Indent();
      code_ += "let _v = {{FIELDVAR}}(type: {{VALUETYPE}}.self)";
      code_ += "try container.encodeIfPresent(_v, forKey: .{{FIELDVAR}})";
      Outdent();
    }
    code_ += "default: break;";
    code_ += "}";
  }